

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O3

void lshbox::loadFvecs<float>(Matrix<float> *data,string *dataFile)

{
  uint uVar1;
  uint uVar2;
  uint _N;
  ostream *poVar3;
  int iVar4;
  int dimension;
  int dim;
  ifstream fin;
  int local_238;
  int local_234;
  long local_230 [4];
  byte abStack_210 [488];
  
  std::ifstream::ifstream(local_230,(dataFile->_M_dataplus)._M_p,_S_bin|_S_ate);
  if ((abStack_210[*(long *)(local_230[0] + -0x18)] & 5) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"cannot open file ",0x11);
    poVar3 = std::operator<<((ostream *)&std::cout,(dataFile->_M_dataplus)._M_p);
    std::endl<char,std::char_traits<char>>(poVar3);
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/xinyandai[P]exactNNS/include/common/util.h"
                  ,0x30,
                  "void lshbox::loadFvecs(lshbox::Matrix<DATATYPE> &, const string &) [DATATYPE = float]"
                 );
  }
  uVar2 = std::istream::tellg();
  std::istream::seekg((long)local_230,_S_beg);
  if (uVar2 != 0) {
    std::istream::read((char *)local_230,(long)&local_238);
    uVar1 = local_238 * 4 + 4;
    _N = uVar2 / uVar1;
    if (uVar2 % uVar1 != 0) {
      __assert_fail("fileSize % bytesPerRecord == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/xinyandai[P]exactNNS/include/common/util.h"
                    ,0x39,
                    "void lshbox::loadFvecs(lshbox::Matrix<DATATYPE> &, const string &) [DATATYPE = float]"
                   );
    }
    Matrix<float>::reset(data,local_238,_N);
    std::istream::read((char *)local_230,(long)data->dims);
    if (1 < _N) {
      iVar4 = 1;
      do {
        std::istream::read((char *)local_230,(long)&local_234);
        if (local_234 != local_238) {
          __assert_fail("dim == dimension",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/xinyandai[P]exactNNS/include/common/util.h"
                        ,0x42,
                        "void lshbox::loadFvecs(lshbox::Matrix<DATATYPE> &, const string &) [DATATYPE = float]"
                       );
        }
        std::istream::read((char *)local_230,(long)(data->dims + local_234 * iVar4));
        iVar4 = iVar4 + 1;
      } while (iVar4 < (int)_N);
    }
    std::ifstream::close();
    std::ifstream::~ifstream(local_230);
    return;
  }
  __assert_fail("fileSize != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/xinyandai[P]exactNNS/include/common/util.h"
                ,0x34,
                "void lshbox::loadFvecs(lshbox::Matrix<DATATYPE> &, const string &) [DATATYPE = float]"
               );
}

Assistant:

void loadFvecs(lshbox::Matrix<DATATYPE>& data, const string& dataFile) {
        std::ifstream fin(dataFile.c_str(), std::ios::binary | std::ios::ate);
        if (!fin) {
            std::cout << "cannot open file " << dataFile.c_str() << std::endl;
            assert(false);
        }
        unsigned fileSize = fin.tellg();
        fin.seekg(0, fin.beg);
        assert(fileSize != 0);

        int dimension;
        fin.read((char*)&dimension, sizeof(int));
        unsigned bytesPerRecord = dimension * sizeof(DATATYPE) + 4;
        assert(fileSize % bytesPerRecord == 0);
        int cardinality = fileSize / bytesPerRecord;

        data.reset(dimension, cardinality);
        fin.read((char *)(data.getData()), sizeof(float) * dimension);

        int dim;
        for (int i = 1; i < cardinality; ++i) {
            fin.read((char*)&dim, sizeof(int));
            assert(dim == dimension);
            fin.read((char *)(data.getData() + i * dimension), sizeof(float) * dimension);
        }
        fin.close();
    }